

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O3

UObject * __thiscall
icu_63::NFFactory::create(NFFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  UObject *pUVar3;
  LocaleKey *lkey;
  Locale loc;
  Locale LStack_108;
  
  iVar1 = (*(this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject[6])
                    (this,key,status);
  if ((char)iVar1 == '\0') {
    pUVar3 = (UObject *)0x0;
  }
  else {
    Locale::Locale(&LStack_108);
    (*(key->super_UObject)._vptr_UObject[0xb])(key,&LStack_108);
    uVar2 = (*(key->super_UObject)._vptr_UObject[10])(key);
    iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[5])
                      (this->_delegate,&LStack_108,(ulong)uVar2);
    pUVar3 = (UObject *)CONCAT44(extraout_var,iVar1);
    if (pUVar3 == (UObject *)0x0) {
      pUVar3 = ICUService::getKey(service,key,(UnicodeString *)0x0,(ICUServiceFactory *)this,status)
      ;
    }
    Locale::~Locale(&LStack_108);
  }
  return pUVar3;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const
    {
        if (handlesKey(key, status)) {
            const LocaleKey& lkey = (const LocaleKey&)key;
            Locale loc;
            lkey.canonicalLocale(loc);
            int32_t kind = lkey.kind();

            UObject* result = _delegate->createFormat(loc, (UNumberFormatStyle)kind);
            if (result == NULL) {
                result = service->getKey((ICUServiceKey&)key /* cast away const */, NULL, this, status);
            }
            return result;
        }
        return NULL;
    }